

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.cc
# Opt level: O0

size_t el::base::utils::File::getSizeOfFile(fstream_t *fs)

{
  undefined1 auVar1 [16];
  fpos local_40 [16];
  fstream_t *local_30;
  size_t size;
  streampos currPos;
  fstream_t *fs_local;
  
  if (fs == (fstream_t *)0x0) {
    fs_local = (fstream_t *)0x0;
  }
  else {
    auVar1 = ::std::istream::tellg();
    _currPos = auVar1._8_8_;
    size = auVar1._0_8_;
    ::std::istream::seekg((long)fs,_S_beg);
    local_40 = (fpos  [16])::std::istream::tellg();
    local_30 = (fstream_t *)::std::fpos::operator_cast_to_long(local_40);
    ::std::istream::seekg(fs,size,_currPos);
    fs_local = local_30;
  }
  return (size_t)fs_local;
}

Assistant:

std::size_t File::getSizeOfFile(base::type::fstream_t* fs) {
  if (fs == nullptr) {
    return 0;
  }
  std::streampos currPos = fs->tellg();
  fs->seekg(0, fs->end);
  std::size_t size = static_cast<std::size_t>(fs->tellg());
  fs->seekg(currPos);
  return size;
}